

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O1

void __thiscall AudioDriver::loadAudioSettings(AudioDriver *this)

{
  bool bVar1;
  uint uVar2;
  SamplerateConversionQuality SVar3;
  Master *this_00;
  QSettings *pQVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString t_1;
  QString prefix;
  QArrayData *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  QArrayData *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  QVariant local_40;
  
  this_00 = Master::getInstance();
  pQVar4 = Master::getSettings(this_00);
  QVar5.m_data = (storage_type *)0x6;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar5);
  QString::append((QString *)&local_58);
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar6.m_data = (storage_type *)0xb;
  QVar6.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar6);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  QVariant::QVariant((QVariant *)&local_78,0);
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  uVar2 = QVariant::toUInt((bool *)&local_40);
  (this->settings).sampleRate = uVar2;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar7.m_data = (storage_type *)0xb;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar7);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  QVariant::QVariant((QVariant *)&local_78,2);
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  SVar3 = QVariant::toUInt((bool *)&local_40);
  (this->settings).srcQuality = SVar3;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar8.m_data = (storage_type *)0x9;
  QVar8.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar8);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_40);
  (this->settings).chunkLen = uVar2;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar9.m_data = (storage_type *)0xd;
  QVar9.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar9);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_40);
  (this->settings).audioLatency = uVar2;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar10.m_data = (storage_type *)0xc;
  QVar10.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar10);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  uVar2 = QVariant::toInt((bool *)&local_40);
  (this->settings).midiLatency = uVar2;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  local_90 = local_58;
  local_88 = local_50;
  uStack_80 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar11.m_data = (storage_type *)0xf;
  QVar11.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar11);
  QString::append((QString *)&local_90);
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.shared = *(int *)local_78.shared + -1;
    UNLOCK();
    if (*(int *)local_78.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,8);
    }
  }
  QVariant::QVariant((QVariant *)&local_78,true);
  QSettings::value((QString *)&local_40,(QVariant *)pQVar4);
  bVar1 = (bool)QVariant::toBool();
  (this->settings).advancedTiming = bVar1;
  QVariant::~QVariant(&local_40);
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_90 != (QArrayData *)0x0) {
    LOCK();
    (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90,2,8);
    }
  }
  (*this->_vptr_AudioDriver[1])(this,&this->settings);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  return;
}

Assistant:

void AudioDriver::loadAudioSettings() {
	QSettings *qSettings = Master::getInstance()->getSettings();
	QString prefix = "Audio/" + id;
	settings.sampleRate = qSettings->value(prefix + "/SampleRate", 0).toUInt();
	settings.srcQuality = MT32Emu::SamplerateConversionQuality(qSettings->value(prefix + "/SRCQuality", MT32Emu::SamplerateConversionQuality_GOOD).toUInt());
	settings.chunkLen = qSettings->value(prefix + "/ChunkLen").toInt();
	settings.audioLatency = qSettings->value(prefix + "/AudioLatency").toInt();
	settings.midiLatency = qSettings->value(prefix + "/MidiLatency").toInt();
	settings.advancedTiming = qSettings->value(prefix + "/AdvancedTiming", true).toBool();
	validateAudioSettings(settings);
}